

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRDBoard.cpp
# Opt level: O3

void __thiscall BRDBoard::BRDBoard(BRDBoard *this,BRDFileBase *boardFile)

{
  SharedVector<Component> *this_00;
  pointer *pppVar1;
  _Rb_tree_node_base *__x;
  undefined8 uVar2;
  pointer ppVar3;
  iterator __position;
  pointer pcVar4;
  pointer psVar5;
  char *__s;
  char *pcVar6;
  shared_ptr<Component> *psVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer psVar8;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  pointer pBVar10;
  char cVar11;
  char cVar12;
  int iVar13;
  Component *__tmp;
  mapped_type *pmVar14;
  element_type *peVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  const_iterator cVar17;
  shared_ptr<Component> *psVar18;
  _Rb_tree_node_base *p_Var19;
  uint uVar20;
  element_type *peVar21;
  long *plVar22;
  shared_ptr<Component> *psVar23;
  EBoardSide EVar24;
  ulong uVar25;
  iterator __first;
  ulong uVar26;
  long lVar27;
  uint __val;
  pointer pBVar28;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var29;
  string *psVar30;
  pointer pBVar31;
  pointer ppVar32;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  __i;
  pointer pBVar33;
  undefined8 *puVar34;
  pointer psVar35;
  bool bVar36;
  shared_ptr<Pin> pin;
  shared_ptr<Net> net_nc;
  string net_name;
  shared_ptr<Net> net_1;
  shared_ptr<Component> comp_dummy;
  shared_ptr<Net> net;
  SharedStringMap<Net> net_map;
  shared_ptr<Component> comp_1;
  vector<BRDPoint,_std::allocator<BRDPoint>_> m_points;
  vector<BRDNail,_std::allocator<BRDNail>_> m_nails;
  vector<BRDPin,_std::allocator<BRDPin>_> m_pins;
  vector<BRDPart,_std::allocator<BRDPart>_> m_parts;
  value_type local_238;
  vector<BRDPin,_std::allocator<BRDPin>_> local_228;
  key_type local_210;
  element_type *local_1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> local_1e0;
  vector<BRDPart,_std::allocator<BRDPart>_> local_1d0;
  undefined1 local_1b8 [8];
  Point PStack_1b0;
  _Base_ptr local_1a8;
  _Rb_tree_node_base *local_1a0;
  _Rb_tree_node_base *local_198;
  size_t local_190;
  vector<std::pair<Point,Point>,std::allocator<std::pair<Point,Point>>> *local_188;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> local_180;
  int iStack_16c;
  SharedVector<Pin> *local_168;
  SharedVector<Net> *local_160;
  SharedVector<Point> *local_158;
  long *local_150;
  ulong local_148;
  long local_140 [2];
  long *local_130;
  ulong local_128;
  long local_120 [2];
  vector<BRDPoint,_std::allocator<BRDPoint>_> local_110;
  vector<BRDNail,_std::allocator<BRDNail>_> local_f8;
  vector<BRDPin,_std::allocator<BRDPin>_> local_e0;
  vector<BRDPart,_std::allocator<BRDPart>_> local_c8;
  long *local_b0;
  ulong local_a8;
  long local_a0 [2];
  long *local_90;
  ulong local_88;
  long local_80 [2];
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  (this->super_Board)._vptr_Board = (_func_int **)&PTR__BRDBoard_0022afb8;
  this->m_file = boardFile;
  local_160 = &this->nets_;
  this_00 = &this->components_;
  local_168 = &this->pins_;
  local_158 = &this->outline_points_;
  local_188 = (vector<std::pair<Point,Point>,std::allocator<std::pair<Point,Point>>> *)
              &this->outline_segments_;
  (this->nets_).super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nets_).super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nets_).super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->components_).
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->components_).
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->components_).
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pins_).super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pins_).super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pins_).super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outline_points_).
  super__Vector_base<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outline_points_).
  super__Vector_base<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outline_points_).
  super__Vector_base<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outline_segments_).
  super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outline_segments_).
  super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outline_segments_).
  super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<BRDPart,_std::allocator<BRDPart>_>::vector
            (&local_c8,(ulong)boardFile->num_parts,(allocator_type *)local_1b8);
  std::vector<BRDPin,_std::allocator<BRDPin>_>::vector
            (&local_e0,(ulong)this->m_file->num_pins,(allocator_type *)local_1b8);
  std::vector<BRDNail,_std::allocator<BRDNail>_>::vector
            (&local_f8,(ulong)this->m_file->num_nails,(allocator_type *)local_1b8);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::vector
            (&local_110,(ulong)this->m_file->num_format,(allocator_type *)local_1b8);
  std::vector<BRDPart,_std::allocator<BRDPart>_>::operator=(&local_c8,&this->m_file->parts);
  std::vector<BRDPin,_std::allocator<BRDPin>_>::operator=(&local_e0,&this->m_file->pins);
  std::vector<BRDNail,_std::allocator<BRDNail>_>::operator=(&local_f8,&this->m_file->nails);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::operator=(&local_110,&this->m_file->format);
  if (local_110.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_110.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar31 = local_110.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      PStack_1b0 = (Point)operator_new(0x18);
      *(undefined8 *)((long)PStack_1b0 + 8) = 0x100000001;
      *(undefined ***)PStack_1b0 = &PTR___Sp_counted_ptr_inplace_0022b028;
      local_1b8 = (undefined1  [8])((long)PStack_1b0 + 0x10);
      *(ulong *)((long)PStack_1b0 + 0x10) = CONCAT44((float)(*pBVar31).y,(float)(*pBVar31).x);
      std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::push_back
                (local_158,(value_type *)local_1b8);
      if (PStack_1b0 != (Point)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)PStack_1b0);
      }
      pBVar31 = pBVar31 + 1;
    } while (pBVar31 !=
             local_110.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>::reserve
            ((vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_> *)local_188
             ,(long)(this->m_file->outline_segments).
                    super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_file->outline_segments).
                    super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
  ppVar32 = (this->m_file->outline_segments).
            super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->m_file->outline_segments).
           super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar32 != ppVar3) {
    do {
      local_1b8._0_4_ = (undefined4)(ppVar32->first).x;
      local_1b8._4_4_ = (undefined4)(ppVar32->first).y;
      PStack_1b0.y = (float)(ppVar32->second).y;
      PStack_1b0.x = (float)(ppVar32->second).x;
      __position._M_current =
           (this->outline_segments_).
           super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->outline_segments_).
          super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<Point,Point>,std::allocator<std::pair<Point,Point>>>::
        _M_realloc_insert<std::pair<Point,Point>>
                  (local_188,__position,(pair<Point,_Point> *)local_1b8);
      }
      else {
        ((__position._M_current)->first).x = (float)local_1b8._0_4_;
        ((__position._M_current)->first).y = (float)local_1b8._4_4_;
        (__position._M_current)->second = PStack_1b0;
        pppVar1 = &(this->outline_segments_).
                   super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      ppVar32 = ppVar32 + 1;
    } while (ppVar32 != ppVar3);
  }
  local_1a0 = (_Rb_tree_node_base *)&PStack_1b0;
  PStack_1b0 = (Point)((ulong)PStack_1b0 & 0xffffffff00000000);
  local_1a8 = (_Base_ptr)0x0;
  local_190 = 0;
  local_198 = local_1a0;
  local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)operator_new(0x60);
  *(undefined8 *)
   &(((element_type *)
     local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
     _M_finish)->super_BoardElement).board_side = 0x100000001;
  (((element_type *)
   local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->super_BoardElement)._vptr_BoardElement =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0022b0a0;
  local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&((element_type *)
                       local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                       super__Vector_impl_data._M_finish)->name;
  (((element_type *)
   local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->name)._M_string_length = 0;
  (((element_type *)
   local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&(((element_type *)
            local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
            super__Vector_impl_data._M_finish)->name).field_2 + 8) = 0;
  *(undefined8 *)
   &((element_type *)
    local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
    _M_finish)->is_ground = 0;
  (((element_type *)
   local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->pins).
  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((element_type *)
   local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->pins).
  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined4 *)
   &(((element_type *)
     local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
     _M_finish)->name)._M_string_length = 2;
  (((element_type *)
   local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->name)._M_dataplus._M_p = (pointer)&PTR_UniqueId_abi_cxx11__0022b0f0;
  (((element_type *)
   local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->name).field_2._M_allocated_capacity =
       (size_type)
       &((element_type *)
        local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
        super__Vector_impl_data._M_finish)->is_ground;
  (((element_type *)
   local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->pins).
  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((element_type *)
   ((long)local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
          super__Vector_impl_data._M_finish + 0x50))->super_BoardElement)._vptr_BoardElement =
       (_func_int **)0x0;
  *(undefined8 *)
   &(((element_type *)
     ((long)local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
            super__Vector_impl_data._M_finish + 0x50))->super_BoardElement).board_side = 0;
  std::__cxx11::string::_M_assign
            ((string *)
             (((element_type *)
              local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
              super__Vector_impl_data._M_finish)->name).field_2._M_local_buf);
  *(undefined1 *)
   &(local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
    _M_start)->name = 0;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                          *)local_1b8,
                         (key_type *)
                         &(local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                           super__Vector_impl_data._M_start)->side);
  (pmVar14->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)
       local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data
       ._M_start;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar14->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
              super__Vector_impl_data._M_finish);
  if (local_f8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      local_f8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    pBVar28 = local_f8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)operator_new(0x60);
      ((local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
        super__Vector_impl_data._M_finish)->mfgcode)._M_dataplus._M_p = (pointer)0x100000001;
      (local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
       super__Vector_impl_data._M_finish)->name = (char *)&PTR___Sp_counted_ptr_inplace_0022b0a0;
      local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&((local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                       super__Vector_impl_data._M_finish)->mfgcode)._M_string_length;
      ((local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
        super__Vector_impl_data._M_finish)->mfgcode).field_2._M_allocated_capacity = 0;
      *(undefined8 *)
       ((long)&((local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                 super__Vector_impl_data._M_finish)->mfgcode).field_2 + 8) = 0;
      (local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
       super__Vector_impl_data._M_finish)->mounting_side = Both;
      (local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
       super__Vector_impl_data._M_finish)->part_type = SMD;
      (local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
       super__Vector_impl_data._M_finish)->end_of_pins = 0;
      ((local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
        super__Vector_impl_data._M_finish)->p1).x = 0;
      *(undefined8 *)
       &((local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
          super__Vector_impl_data._M_finish)->p1).y = 0;
      *(undefined8 *)
       &((local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
          super__Vector_impl_data._M_finish)->p2).y = 0;
      *(undefined4 *)
       &((local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
          super__Vector_impl_data._M_finish)->mfgcode).field_2 = 2;
      ((local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
        super__Vector_impl_data._M_finish)->mfgcode)._M_string_length =
           (size_type)&PTR_UniqueId_abi_cxx11__0022b0f0;
      *(uint **)((long)&((local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                          super__Vector_impl_data._M_finish)->mfgcode).field_2 + 8) =
           &(local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
             super__Vector_impl_data._M_finish)->end_of_pins;
      local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_finish[1].name = (char *)0x0;
      local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_finish[1].mfgcode._M_dataplus._M_p = (pointer)0x0;
      local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_finish[1].mfgcode._M_string_length = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,pBVar28->net,(allocator<char> *)&local_1e0);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x10),(string *)&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,kNetUnconnectedPrefix_abi_cxx11_._M_dataplus._M_p,
                 kNetUnconnectedPrefix_abi_cxx11_._M_dataplus._M_p +
                 kNetUnconnectedPrefix_abi_cxx11_._M_string_length);
      pcVar4 = (((string *)
                ((long)local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                       super__Vector_impl_data._M_start + 0x10))->_M_dataplus)._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar4,
                 pcVar4 + ((string *)
                          ((long)local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 0x10))->_M_string_length
                );
      if (local_48 < local_a8) {
        bVar36 = false;
      }
      else {
        plVar22 = local_b0;
        if (local_a8 != 0) {
          uVar26 = 0;
          do {
            if (*(char *)((long)local_b0 + uVar26) != *(char *)((long)local_50 + uVar26)) {
              plVar22 = (long *)((long)local_b0 + uVar26);
              break;
            }
            uVar26 = uVar26 + 1;
            plVar22 = (long *)((long)local_b0 + local_a8);
          } while (local_a8 != uVar26);
        }
        bVar36 = plVar22 == (long *)((long)local_b0 + local_a8);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      if (!bVar36) {
        *(uint *)&((BoardElement *)
                  &(local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                    super__Vector_impl_data._M_start)->name)->field_0xc = pBVar28->probe;
        ((BoardElement *)
        &(local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
          super__Vector_impl_data._M_start)->name)->board_side = (uint)(pBVar28->side != Top);
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                                *)local_1b8,
                               (string *)
                               ((long)local_1d0.
                                      super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                                      super__Vector_impl_data._M_start + 0x10));
        (pmVar14->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)
             local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
             super__Vector_impl_data._M_start;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar14->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      }
      if (local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_1d0.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      pBVar28 = pBVar28 + 1;
    } while (pBVar28 !=
             local_f8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((element_type *)
      local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
      _M_finish != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  if (local_c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      local_c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    pBVar33 = local_c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      peVar15 = (element_type *)operator_new(0xf8);
      *(undefined8 *)&(peVar15->super_BoardElement).board_side = 0x100000001;
      (peVar15->super_BoardElement)._vptr_BoardElement =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_0022b130;
      memset(&(peVar15->name).field_2,0,0xd8);
      (peVar15->name)._M_string_length = 2;
      (peVar15->name)._M_dataplus._M_p = (pointer)&PTR_UniqueId_abi_cxx11__0022b180;
      *(SharedVector<Pin> **)((long)&(peVar15->name).field_2 + 8) = &peVar15->pins;
      (peVar15->pins).
      super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&peVar15[1].super_BoardElement.board_side
      ;
      peVar15[1].name._M_string_length = 0;
      peVar15[1].name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&peVar15[1].name.field_2 + 8) = 0;
      *(undefined8 *)&peVar15[1].is_ground = 0;
      peVar15[1].pins.
      super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      peVar15[1].pins.
      super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      peVar15[1].pins.
      super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      peVar15[2].super_BoardElement._vptr_BoardElement = (_func_int **)0x0;
      *(undefined8 *)((long)&peVar15[2].super_BoardElement._vptr_BoardElement + 1) = 0;
      *(undefined8 *)((long)&peVar15[2].super_BoardElement.board_side + 1) = 0;
      peVar15[2].name._M_string_length = 0;
      peVar15[2].name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&peVar15[2].name.field_2 + 8) = 0;
      *(undefined8 *)&peVar15[2].is_ground = 0;
      peVar15[2].pins.
      super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      peVar15[2].pins.
      super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined8 *)
       ((long)&peVar15[2].pins.
               super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
      *(undefined8 *)
       ((long)&peVar15[2].pins.
               super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
      local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&peVar15->name;
      local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)peVar15;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,pBVar33->name,(allocator<char> *)&local_1d0);
      std::__cxx11::string::operator=
                ((string *)
                 (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&(local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                        super__Vector_impl_data._M_start)->side)->_M_local_buf + 8),
                 (string *)&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::operator=
                ((string *)
                 ((long)local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x38),(string *)&pBVar33->mfgcode);
      (((element_type *)
       ((long)local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
              super__Vector_impl_data._M_start + 0x50))->pins).
      super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44((float)(pBVar33->p1).y,(float)(pBVar33->p1).x);
      (((element_type *)
       ((long)local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
              super__Vector_impl_data._M_start + 0x50))->pins).
      super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44((float)(pBVar33->p2).y,(float)(pBVar33->p2).x);
      local_130 = local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,kComponentDummyName_abi_cxx11_._M_dataplus._M_p,
                 kComponentDummyName_abi_cxx11_._M_dataplus._M_p +
                 kComponentDummyName_abi_cxx11_._M_string_length);
      lVar27 = *(long *)((long)&(local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->side + 8);
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,lVar27,
                 lVar27 + ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)&(local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                _M_impl.super__Vector_impl_data._M_start)->side)[1].
                          _M_allocated_capacity);
      if (local_68 < local_128) {
        bVar36 = false;
      }
      else {
        plVar22 = local_130;
        if (local_128 != 0) {
          uVar26 = 0;
          do {
            if (*(char *)((long)local_130 + uVar26) != *(char *)((long)local_70 + uVar26)) {
              plVar22 = (long *)((long)local_130 + uVar26);
              break;
            }
            uVar26 = uVar26 + 1;
            plVar22 = (long *)((long)local_130 + local_128);
          } while (local_128 != uVar26);
        }
        bVar36 = plVar22 == (long *)((long)local_130 + local_128);
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if (local_130 != local_120) {
        operator_delete(local_130,local_120[0] + 1);
      }
      if (bVar36) {
        *(undefined4 *)
         &(local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
           super__Vector_impl_data._M_start)->side = 1;
      }
      EVar24 = (pBVar33->mounting_side != Bottom) + kBoardSideBottom;
      if (pBVar33->mounting_side == Top) {
        EVar24 = kBoardSideTop;
      }
      ((BoardElement *)
      &(local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
        super__Vector_impl_data._M_start)->pos)->board_side = EVar24;
      *(uint *)&((BoardElement *)
                &(local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                  super__Vector_impl_data._M_start)->pos)->field_0xc =
           2 - (uint)(pBVar33->part_type == SMD);
      std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
      push_back(this_00,(value_type *)&local_228);
      if ((element_type *)
          local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
          super__Vector_impl_data._M_finish != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      pBVar33 = pBVar33 + 1;
    } while (pBVar33 !=
             local_c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xf8);
  p_Var16->_M_use_count = 1;
  p_Var16->_M_weak_count = 1;
  p_Var16->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0022b130;
  memset(p_Var16 + 2,0,0xd8);
  p_Var16[1]._M_use_count = 2;
  p_Var16[1]._M_weak_count = 0;
  p_Var16[1]._vptr__Sp_counted_base = (_func_int **)&PTR_UniqueId_abi_cxx11__0022b180;
  *(_Atomic_word **)&p_Var16[2]._M_use_count = &p_Var16[3]._M_use_count;
  *(_Atomic_word **)&p_Var16[4]._M_use_count = &p_Var16[5]._M_use_count;
  p_Var16[6]._M_use_count = 0;
  p_Var16[6]._M_weak_count = 0;
  p_Var16[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var16[7]._M_use_count = 0;
  p_Var16[7]._M_weak_count = 0;
  p_Var16[8]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var16[8]._M_use_count = 0;
  p_Var16[8]._M_weak_count = 0;
  p_Var16[9]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var16[9]._M_use_count = 0;
  p_Var16[9]._M_weak_count = 0;
  p_Var16[10]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined8 *)((long)&p_Var16[10]._vptr__Sp_counted_base + 1) = 0;
  *(undefined8 *)((long)&p_Var16[10]._M_use_count + 1) = 0;
  p_Var16[0xb]._M_use_count = 0;
  p_Var16[0xb]._M_weak_count = 0;
  p_Var16[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var16[0xc]._M_use_count = 0;
  p_Var16[0xc]._M_weak_count = 0;
  p_Var16[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var16[0xd]._M_use_count = 0;
  p_Var16[0xd]._M_weak_count = 0;
  p_Var16[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined8 *)((long)&p_Var16[0xe]._vptr__Sp_counted_base + 1) = 0;
  *(undefined8 *)((long)&p_Var16[0xe]._M_use_count + 1) = 0;
  local_1e0._M_ptr = (element_type *)(p_Var16 + 1);
  local_1e0._M_refcount._M_pi = p_Var16;
  std::__cxx11::string::_M_assign((string *)&p_Var16[2]._M_use_count);
  (local_1e0._M_ptr)->component_type = kComponentTypeDummy;
  std::vector<BRDPin,_std::allocator<BRDPin>_>::vector(&local_228,&local_e0);
  std::vector<BRDPart,_std::allocator<BRDPart>_>::vector(&local_1d0,&local_c8);
  if (local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    iVar13 = 1;
    __val = 0;
    uVar26 = 0;
    do {
      pBVar10 = local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar20 = *(int *)((long)&(local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                _M_impl.super__Vector_impl_data._M_start)->pos + uVar26 * 0x38 + 0xc
                       ) - 1;
      psVar5 = (this_00->
               super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_180._M_ptr =
           psVar5[uVar20].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_180._M_refcount._M_pi =
           psVar5[uVar20].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_180._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_180._M_refcount._M_pi)->_M_use_count =
               (local_180._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_180._M_refcount._M_pi)->_M_use_count =
               (local_180._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (local_180._M_ptr != (element_type *)0x0) {
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x88);
        (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = 1;
        (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count = 1;
        (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0022b1b0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _M_use_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _M_weak_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
        _M_use_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
        _M_weak_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
        _M_use_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
        _M_weak_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
        _M_use_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
        _M_weak_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
        _M_use_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
        _M_weak_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[6].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[6].
        _M_use_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[6].
        _M_weak_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[7].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _M_use_count = 2;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _vptr__Sp_counted_base = (_func_int **)&PTR_UniqueId_abi_cxx11__0022b200;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
        _vptr__Sp_counted_base =
             (_func_int **)
             (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 3);
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
        _vptr__Sp_counted_base =
             (_func_int **)
             (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 5);
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[7].
        _M_use_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[7].
        _M_weak_count = 0;
        local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[8].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        if ((local_180._M_ptr)->component_type == kComponentTypeDummy) {
          local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_weak_count = 4;
          p_Var9 = (__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)&local_1e0._M_ptr;
          p_Var29 = &local_1e0;
          peVar21 = local_1e0._M_ptr;
        }
        else {
          local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_weak_count = 2;
          p_Var9 = &local_180;
          p_Var29 = &local_180;
          peVar21 = local_180._M_ptr;
        }
        *(element_type **)
         &local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[7].
          _M_use_count = peVar21;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   + 8),&p_Var9->_M_refcount);
        std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::push_back
                  (&p_Var29->_M_ptr->pins,&local_238);
        puVar34 = (undefined8 *)((long)&pBVar10->pos + uVar26 * 0x38);
        uVar20 = __val + 1;
        iStack_16c = *(int *)((long)puVar34 + 0xc);
        __val = 1;
        if (iStack_16c == iVar13) {
          __val = uVar20;
        }
        __s = (char *)puVar34[5];
        if (__s == (char *)0x0) {
          cVar12 = '\x01';
          if (9 < __val) {
            cVar11 = '\x04';
            do {
              cVar12 = cVar11;
              if (uVar20 < 100) {
                cVar12 = cVar12 + -2;
                goto LAB_00121be5;
              }
              if (uVar20 < 1000) {
                cVar12 = cVar12 + -1;
                goto LAB_00121be5;
              }
              if (uVar20 < 10000) goto LAB_00121be5;
              bVar36 = 99999 < uVar20;
              uVar20 = uVar20 / 10000;
              cVar11 = cVar12 + '\x04';
            } while (bVar36);
            cVar12 = cVar12 + '\x01';
          }
LAB_00121be5:
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_210,cVar12);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_210._M_dataplus._M_p,(uint)local_210._M_string_length,__val);
          std::__cxx11::string::operator=
                    ((string *)
                     &(local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->number
                     ,(string *)&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          pcVar6 = (char *)((local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           number)._M_string_length;
          psVar30 = &(local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->number;
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)psVar30,0,pcVar6,(ulong)__s);
        }
        if ((char *)puVar34[6] == (char *)0x0) {
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,(char *)puVar34[6],(allocator<char> *)&local_1f0);
          std::__cxx11::string::operator=
                    ((string *)
                     &(local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name,
                     (string *)&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
        }
        uVar2 = *puVar34;
        ((local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->position).x =
             (float)(int)uVar2;
        ((local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->position).y =
             (float)(int)((ulong)uVar2 >> 0x20);
        EVar24 = (*(int *)(puVar34 + 2) != 1) + kBoardSideBottom;
        if (*(int *)(puVar34 + 2) == 2) {
          EVar24 = kBoardSideTop;
        }
        ((local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_BoardElement)
        .board_side = EVar24;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,(char *)puVar34[3],(allocator<char> *)&local_1f0);
        cVar17 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                         *)local_1b8,&local_210);
        if (cVar17._M_node == (_Base_ptr)&PStack_1b0) {
          if (CONCAT44(local_210._M_string_length._4_4_,(uint)local_210._M_string_length) == 0) {
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                                    *)local_1b8,&kNetUnconnectedPrefix_abi_cxx11_);
          }
          else {
            local_150 = local_140;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,kNetUnconnectedPrefix_abi_cxx11_._M_dataplus._M_p,
                       kNetUnconnectedPrefix_abi_cxx11_._M_dataplus._M_p +
                       kNetUnconnectedPrefix_abi_cxx11_._M_string_length);
            local_90 = local_80;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,local_210._M_dataplus._M_p,
                       local_210._M_dataplus._M_p +
                       CONCAT44(local_210._M_string_length._4_4_,(uint)local_210._M_string_length));
            if (local_88 < local_148) {
              bVar36 = false;
            }
            else {
              plVar22 = local_150;
              if (local_148 != 0) {
                uVar25 = 0;
                do {
                  if (*(char *)((long)local_150 + uVar25) != *(char *)((long)local_90 + uVar25)) {
                    plVar22 = (long *)((long)local_150 + uVar25);
                    break;
                  }
                  uVar25 = uVar25 + 1;
                  plVar22 = (long *)((long)local_150 + local_148);
                } while (local_148 != uVar25);
              }
              bVar36 = plVar22 == (long *)((long)local_150 + local_148);
            }
            if (local_90 != local_80) {
              operator_delete(local_90,local_80[0] + 1);
            }
            if (local_150 != local_140) {
              operator_delete(local_150,local_140[0] + 1);
            }
            if (!bVar36) {
              local_1e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
              (local_1e8._M_pi)->_M_use_count = 1;
              (local_1e8._M_pi)->_M_weak_count = 1;
              (local_1e8._M_pi)->_vptr__Sp_counted_base =
                   (_func_int **)&PTR___Sp_counted_ptr_inplace_0022b0a0;
              local_1f0 = (element_type *)(local_1e8._M_pi + 1);
              local_1e8._M_pi[1]._M_use_count = 0;
              local_1e8._M_pi[1]._M_weak_count = 0;
              local_1e8._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
              local_1e8._M_pi[2]._M_use_count = 0;
              local_1e8._M_pi[2]._M_weak_count = 0;
              local_1e8._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
              local_1e8._M_pi[3]._M_use_count = 0;
              local_1e8._M_pi[3]._M_weak_count = 0;
              local_1e8._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
              local_1e8._M_pi[1]._M_use_count = 2;
              local_1e8._M_pi[1]._vptr__Sp_counted_base =
                   (_func_int **)&PTR_UniqueId_abi_cxx11__0022b0f0;
              local_1e8._M_pi[2]._vptr__Sp_counted_base = (_func_int **)(local_1e8._M_pi + 3);
              local_1e8._M_pi[4]._M_use_count = 0;
              local_1e8._M_pi[4]._M_weak_count = 0;
              local_1e8._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
              local_1e8._M_pi[5]._M_use_count = 0;
              local_1e8._M_pi[5]._M_weak_count = 0;
              std::__cxx11::string::_M_assign((string *)(local_1e8._M_pi + 2));
              (local_1f0->super_BoardElement).board_side =
                   ((local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   super_BoardElement).board_side;
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                                      *)local_1b8,&local_210);
              (pmVar14->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_1f0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(pmVar14->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                         ,&local_1e8);
              (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net =
                   local_1f0;
              peVar15 = local_1f0;
              if (local_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8._M_pi);
                peVar15 = (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          net;
              }
              goto LAB_00121f20;
            }
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                                    *)local_1b8,&kNetUnconnectedPrefix_abi_cxx11_);
          }
          peVar15 = (pmVar14->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net = peVar15;
          *(_Atomic_word *)
           &((local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_BoardElement).field_0xc = 1;
        }
        else {
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                                  *)local_1b8,&local_210);
          peVar15 = (pmVar14->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net = peVar15;
        }
LAB_00121f20:
        (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->diameter =
             (float)(double)puVar34[4];
        std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::push_back
                  (&peVar15->pins,&local_238);
        std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::push_back
                  (local_168,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        iVar13 = iStack_16c;
        if (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_238.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                    );
          iVar13 = iStack_16c;
        }
      }
      if (local_180._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180._M_refcount._M_pi);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < (ulong)(((long)local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  psVar18 = (this->components_).
            super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (this->components_).
           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar25 = (long)psVar7 - (long)psVar18;
  psVar23 = psVar18;
  uVar26 = uVar25;
  if (0 < (long)uVar25 >> 6) {
    psVar23 = (shared_ptr<Component> *)
              ((long)&(psVar18->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
              (uVar25 & 0xffffffffffffffc0));
    lVar27 = ((long)uVar25 >> 6) + 1;
    __first._M_current = psVar18 + 2;
    do {
      if ((__first._M_current[-2].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->component_type == kComponentTypeDummy) {
        __first._M_current = __first._M_current + -2;
        goto LAB_00122084;
      }
      if ((__first._M_current[-1].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->component_type == kComponentTypeDummy) {
        __first._M_current = __first._M_current + -1;
        goto LAB_00122084;
      }
      if ((((__first._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ->component_type == kComponentTypeDummy) goto LAB_00122084;
      if ((__first._M_current[1].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          component_type == kComponentTypeDummy) {
        __first._M_current = __first._M_current + 1;
        goto LAB_00122084;
      }
      lVar27 = lVar27 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar27);
    uVar26 = (long)psVar7 - (long)psVar23;
  }
  lVar27 = (long)uVar26 >> 4;
  if (lVar27 == 1) {
LAB_00122064:
    __first._M_current = psVar23;
    if (((psVar23->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        component_type != kComponentTypeDummy) {
      __first._M_current = psVar7;
    }
  }
  else if (lVar27 == 2) {
LAB_00122057:
    __first._M_current = psVar23;
    if (((psVar23->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        component_type != kComponentTypeDummy) {
      psVar23 = psVar23 + 1;
      goto LAB_00122064;
    }
  }
  else {
    __first._M_current = psVar7;
    if (lVar27 != 3) goto LAB_001220e2;
    __first._M_current = psVar23;
    if (((psVar23->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        component_type != kComponentTypeDummy) {
      psVar23 = psVar23 + 1;
      goto LAB_00122057;
    }
  }
LAB_00122084:
  psVar23 = __first._M_current + 1;
  if (psVar23 != psVar7 && __first._M_current != psVar7) {
    do {
      peVar21 = (psVar23->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar21->component_type != kComponentTypeDummy) {
        p_Var16 = (psVar23->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                  _M_pi;
        (psVar23->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        (psVar23->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ((__first._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             peVar21;
        this_01 = ((__first._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        ((__first._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = p_Var16;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        __first._M_current = __first._M_current + 1;
      }
      psVar23 = psVar23 + 1;
    } while (psVar23 != psVar7);
    psVar18 = (this->components_).
              super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar25 = (long)(this->components_).
                   super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar18;
  }
LAB_001220e2:
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::_M_erase
            (this_00,__first,
             (shared_ptr<Component> *)
             ((long)&(psVar18->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
             uVar25));
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::push_back
            (this_00,(value_type *)&local_1e0);
  std::vector<BRDPart,_std::allocator<BRDPart>_>::~vector(&local_1d0);
  if ((element_type *)
      local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
      _M_start != (element_type *)0x0) {
    operator_delete(local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e0._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_refcount._M_pi);
  }
  p_Var19 = local_1a0;
  if (local_1a0 != (_Rb_tree_node_base *)&PStack_1b0) {
    do {
      __x = p_Var19 + 2;
      iVar13 = std::__cxx11::string::compare((char *)(*(long *)(p_Var19 + 2) + 0x10));
      if (iVar13 == 0) {
        bVar36 = true;
      }
      else {
        iVar13 = std::__cxx11::string::compare((char *)(*(long *)__x + 0x10));
        bVar36 = iVar13 == 0;
      }
      *(bool *)(*(long *)__x + 0x30) = bVar36;
      std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::push_back
                (local_160,(value_type *)__x);
      p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
    } while (p_Var19 != (_Rb_tree_node_base *)&PStack_1b0);
  }
  psVar5 = (this->components_).
           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar8 = (this->components_).
           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar8) {
    uVar26 = (long)psVar8 - (long)psVar5 >> 4;
    lVar27 = 0x3f;
    if (uVar26 != 0) {
      for (; uVar26 >> lVar27 == 0; lVar27 = lVar27 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<BRDBoard::BRDBoard(BRDFileBase_const*)::__2>>
              (psVar5,psVar8,((uint)lVar27 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)psVar8 - (long)psVar5 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,__gnu_cxx::__ops::_Iter_comp_iter<BRDBoard::BRDBoard(BRDFileBase_const*)::__2>>
                (psVar5,psVar8);
    }
    else {
      psVar35 = psVar5 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,__gnu_cxx::__ops::_Iter_comp_iter<BRDBoard::BRDBoard(BRDFileBase_const*)::__2>>
                (psVar5,psVar35);
      for (; psVar35 != psVar8; psVar35 = psVar35 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,__gnu_cxx::__ops::_Val_comp_iter<BRDBoard::BRDBoard(BRDFileBase_const*)::__2>>
                  (psVar35);
      }
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
               *)local_1b8);
  if (local_110.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<BRDPart,_std::allocator<BRDPart>_>::~vector(&local_c8);
  return;
}

Assistant:

BRDBoard::BRDBoard(const BRDFileBase * const boardFile)
    : m_file(boardFile) {
	// TODO: strip / trim all strings, especially those used as keys
	// TODO: just loop through original arrays?
	std::vector<BRDPart> m_parts(m_file->num_parts);
	std::vector<BRDPin> m_pins(m_file->num_pins);
	std::vector<BRDNail> m_nails(m_file->num_nails);
	std::vector<BRDPoint> m_points(m_file->num_format);

	m_parts  = m_file->parts;
	m_pins   = m_file->pins;
	m_nails  = m_file->nails;
	m_points = m_file->format;

	// Set outline
	{
		for (auto &brdPoint : m_points) {
			auto point = std::make_shared<Point>(brdPoint.x, brdPoint.y);
			outline_points_.push_back(point);
		}
	}

	outline_segments_.reserve(m_file->outline_segments.size());
	std::transform(m_file->outline_segments.begin(), m_file->outline_segments.end(), std::back_inserter(outline_segments_), [](const std::pair<BRDPoint, BRDPoint> &s) -> std::pair<Point, Point> {
		return {{s.first.x, s.first.y}, {s.second.x, s.second.y}};
	});

	// Populate map of unique nets
	SharedStringMap<Net> net_map;
	{
		// adding special net 'UNCONNECTED'
		auto net_nc           = std::make_shared<Net>();
		net_nc->name          = kNetUnconnectedPrefix;
		net_nc->is_ground     = false;
		net_map[net_nc->name] = net_nc;

		// handle all the others
		for (auto &brd_nail : m_nails) {
			auto net = std::make_shared<Net>();

			// copy NET name and number (probe)
			net->name = std::string(brd_nail.net);

			// avoid having multiple UNCONNECTED<XXX> references
			if (is_prefix(kNetUnconnectedPrefix, net->name)) continue;

			net->number    = brd_nail.probe;

			if (brd_nail.side == BRDPartMountingSide::Top) {
				net->board_side = kBoardSideTop;
			} else {
				net->board_side = kBoardSideBottom;
			}

			// so we can find nets later by name (making unique by name)
			net_map[net->name] = net;
		}
	}

	// Populate parts
	{
		for (auto &brd_part : m_parts) {
			auto comp = std::make_shared<Component>();

			comp->name    = std::string(brd_part.name);
			comp->mfgcode = std::move(brd_part.mfgcode);

			comp->p1 = {brd_part.p1.x, brd_part.p1.y};
			comp->p2 = {brd_part.p2.x, brd_part.p2.y};

			// is it some dummy component to indicate test pads?
			if (is_prefix(kComponentDummyName, comp->name)) comp->component_type = Component::kComponentTypeDummy;

			// check what side the board is on (sorcery?)
			if (brd_part.mounting_side == BRDPartMountingSide::Top) {
				comp->board_side = kBoardSideTop;
			} else if (brd_part.mounting_side == BRDPartMountingSide::Bottom) {
				comp->board_side = kBoardSideBottom;
			} else {
				comp->board_side = kBoardSideBoth;
			}

			comp->mount_type = (brd_part.part_type == BRDPartType::SMD) ? Component::kMountTypeSMD : Component::kMountTypeDIP;

			components_.push_back(comp);
		}
	}

	// Populate pins
	{
		// generate dummy component as reference
		auto comp_dummy            = std::make_shared<Component>();
		comp_dummy->name           = kComponentDummyName;
		comp_dummy->component_type = Component::kComponentTypeDummy;

		// NOTE: originally the pin diameter depended on part.name[0] == 'U' ?
		unsigned int pin_idx  = 0;
		unsigned int part_idx = 1;
		auto pins             = m_pins;
		auto parts            = m_parts;

		for (size_t i = 0; i < pins.size(); i++) {
			// (originally from BoardView::DrawPins)
			const BRDPin &brd_pin = pins[i];
			std::shared_ptr<Component> comp       = components_[brd_pin.part - 1];

			if (!comp) continue;

			auto pin = std::make_shared<Pin>();

			if (comp->is_dummy()) {
				// component is virtual, i.e. "...", pin is test pad
				pin->type      = Pin::kPinTypeTestPad;
				pin->component = comp_dummy;
				comp_dummy->pins.push_back(pin);
			} else {
				// component is regular / not virtual
				pin->type       = Pin::kPinTypeComponent;
				pin->component  = comp;
				comp->pins.push_back(pin);
			}

			// determine pin number on part
			++pin_idx;
			if (brd_pin.part != part_idx) {
				part_idx = brd_pin.part;
				pin_idx  = 1;
			}
			if (brd_pin.snum) {
				pin->number = brd_pin.snum;
			} else {
				pin->number = std::to_string(pin_idx);
			}

			// Lets us see BGA pad names finally
			//
			if (brd_pin.name) {
				pin->name = std::string(brd_pin.name);
			} else {
				pin->name = pin->number;
			}

			// copy position
			pin->position = Point(brd_pin.pos.x, brd_pin.pos.y);

			// Set board side for pins from specific setting
			if (brd_pin.side == BRDPinSide::Top) {
				pin->board_side = kBoardSideTop;
			} else if (brd_pin.side == BRDPinSide::Bottom) {
				pin->board_side = kBoardSideBottom;
			} else {
				pin->board_side = kBoardSideBoth;
			}

			// set net reference (here's our NET key string again)
			std::string net_name = std::string(brd_pin.net);
			if (net_map.count(net_name)) {
				// there is a net with that name in our map
				pin->net = net_map[net_name].get();
			} else {
				// no net with that name registered, so create one
				if (!net_name.empty()) {
					if (is_prefix(kNetUnconnectedPrefix, net_name)) {
						// pin is unconnected, so reference our special net
						pin->net  = net_map[kNetUnconnectedPrefix].get();
						pin->type = Pin::kPinTypeNotConnected;
					} else {
						// indeed a new net
						auto net        = std::make_shared<Net>();
						net->name       = net_name;
						net->board_side = pin->board_side;
						// NOTE: net->number not set
						net_map[net_name] = net;
						pin->net          = net.get();
					}
				} else {
					// not sure this can happen -> no info
					// It does happen in .fz apparently and produces a SEGFAULT… Use
					// unconnected net.
					pin->net  = net_map[kNetUnconnectedPrefix].get();
					pin->type = Pin::kPinTypeNotConnected;
				}
			}

			// TODO: should either depend on file specs or type etc
			//
			//  if(brd_pin.radius) pin->diameter = brd_pin.radius; // some format
			//  (.fz) contains a radius field
			//    else pin->diameter = 0.5f;
			pin->diameter = brd_pin.radius; // some format (.fz) contains a radius field

			pin->net->pins.push_back(pin);
			pins_.push_back(pin);
		}

		// remove all dummy components from vector, add our official dummy
		components_.erase(
		    remove_if(begin(components_), end(components_), [](std::shared_ptr<Component> &comp) { return comp->is_dummy(); }),
		    end(components_));

		components_.push_back(comp_dummy);
	}

	// Populate Net vector by using the map. (sorted by keys)
	for (auto &net : net_map) {
		// check whether the pin represents ground
		net.second->is_ground = (net.second->name == "GND" || net.second->name == "GROUND");
		nets_.push_back(net.second);
	}

	// Sort components by name
	sort(begin(components_), end(components_), [](const std::shared_ptr<Component> &lhs, const std::shared_ptr<Component> &rhs) {
		return lhs->name < rhs->name;
	});
}